

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

If_DsdMan_t * If_DsdManFilter(If_DsdMan_t *p,int Limit)

{
  If_DsdMan_t *pNew;
  Vec_Int_t *p_00;
  void *pvVar1;
  int i;
  
  pNew = If_DsdManAlloc(p->nVars,p->LutSize);
  p_00 = Vec_IntStartFull((p->vObjs).nSize);
  Vec_IntWriteEntry(p_00,0,0);
  Vec_IntWriteEntry(p_00,1,1);
  for (i = 2; i < (p->vObjs).nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(&p->vObjs,i);
    if (Limit <= (int)(*(uint *)((long)pvVar1 + 4) >> 9 & 0x3ffff)) {
      If_DsdManFilter_rec(pNew,p,i,p_00);
    }
  }
  Vec_IntFree(p_00);
  return pNew;
}

Assistant:

If_DsdMan_t * If_DsdManFilter( If_DsdMan_t * p, int Limit )
{
    If_DsdMan_t * pNew = If_DsdManAlloc( p->nVars, p->LutSize );
    If_DsdObj_t * pObj; 
    Vec_Int_t * vMap;
    int i;
    vMap = Vec_IntStartFull( Vec_PtrSize(&p->vObjs) );
    Vec_IntWriteEntry( vMap, 0, 0 );
    Vec_IntWriteEntry( vMap, 1, 1 );
    If_DsdVecForEachNode( &p->vObjs, pObj, i )
        if ( (int)pObj->Count >= Limit )
            If_DsdManFilter_rec( pNew, p, i, vMap );
    Vec_IntFree( vMap );
    return pNew;
}